

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLinker.cpp
# Opt level: O3

int __thiscall COLLADASaxFWL::FormulasLinker::link(FormulasLinker *this,char *__from,char *__to)

{
  size_t sVar1;
  Formula *__from_00;
  size_t sVar2;
  INode **ppIVar3;
  int iVar4;
  undefined4 extraout_var;
  size_t sVar6;
  size_t sVar7;
  bool success;
  INode *pIVar5;
  
  sVar1 = this->mFormulas->mCount;
  iVar4 = (int)CONCAT71((int7)((ulong)this->mFormulas >> 8),1);
  if (sVar1 != 0) {
    sVar7 = 0;
    do {
      pIVar5 = (INode *)this->mFormulas->mData;
      __from_00 = *(Formula **)(pIVar5 + sVar7);
      sVar2 = (__from_00->mMathmlAsts).mCount;
      if (sVar2 != 0) {
        sVar6 = 0;
        do {
          ppIVar3 = (__from_00->mMathmlAsts).mData;
          iVar4 = link(this,(char *)__from_00,(char *)ppIVar3[sVar6]);
          pIVar5 = (INode *)CONCAT44(extraout_var,iVar4);
          ppIVar3[sVar6] = pIVar5;
          sVar6 = sVar6 + 1;
        } while (sVar2 != sVar6);
      }
      sVar7 = sVar7 + 1;
    } while (sVar7 != sVar1);
    iVar4 = (int)CONCAT71((int7)((ulong)pIVar5 >> 8),1);
  }
  return iVar4;
}

Assistant:

bool FormulasLinker::link()
	{
		size_t formulasCount = mFormulas.getCount();
		for ( size_t i = 0; i < formulasCount; ++i)
		{
			COLLADAFW::Formula* formula = mFormulas[i];
			COLLADAFW::MathmlAstArray& asts = formula->getMathmlAsts();
			size_t astsCount = asts.getCount();
			for ( size_t j = 0; j < astsCount; ++j)
			{
				MathML::AST::INode*& astNode =  asts[j];
				bool success = true;
				astNode = link( formula, astNode, success);
				if ( !success )
					return false;
			}
		}
		return true;
	}